

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O3

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::nosize_transfer_element
          (table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *this,DiagCode *p,ulong hash,arrays_type *arrays_,long *num_destroyed)

{
  pair<slang::DiagCode_&&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&>
  local_38;
  locator local_28;
  
  *num_destroyed = *num_destroyed + 1;
  local_38.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p + 2);
  local_38.first = p;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,std::__cxx11::string>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::DiagCode,void>,std::equal_to<slang::DiagCode>,std::allocator<std::pair<slang::DiagCode_const,std::__cxx11::string>>>
  ::nosize_unchecked_emplace_at<std::pair<slang::DiagCode&&,std::__cxx11::string&&>>
            (&local_28,
             (table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,std::__cxx11::string>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::DiagCode,void>,std::equal_to<slang::DiagCode>,std::allocator<std::pair<slang::DiagCode_const,std::__cxx11::string>>>
              *)this,arrays_,hash >> ((byte)arrays_->groups_size_index & 0x3f),hash,&local_38);
  if (*(DiagCode **)(p + 2) != p + 6) {
    operator_delete(*(DiagCode **)(p + 2),*(long *)(p + 6) + 1);
  }
  return;
}

Assistant:

void nosize_transfer_element(element_type* p, std::size_t hash, const arrays_type& arrays_,
                                 std::size_t& num_destroyed, std::true_type /* ->move */) {
        /* Destroy p even if an an exception is thrown in the middle of move
         * construction, which could leave the source half-moved.
         */
        ++num_destroyed;
        destroy_element_on_exit d{this, p};
        (void)d;
        nosize_unchecked_emplace_at(arrays_, position_for(hash, arrays_), hash,
                                    type_policy::move(*p));
    }